

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O1

CURLcode pop3_disconnect(connectdata *conn,_Bool dead_connection)

{
  size_t sVar1;
  CURLcode CVar2;
  undefined7 in_register_00000031;
  pop3_conn *pop3c;
  
  if ((((int)CONCAT71(in_register_00000031,dead_connection) == 0) &&
      (sVar1 = (conn->proto).sshc.readdir_len, sVar1 != 0)) &&
     ((*(byte *)(sVar1 + 0x3b5) & 0x10) != 0)) {
    CVar2 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"%s","QUIT");
    if (CVar2 == CURLE_OK) {
      (conn->proto).imapc.state = IMAP_FETCH_FINAL;
      do {
        CVar2 = Curl_pp_statemach(&(conn->proto).ftpc.pp,true,true);
        if ((conn->proto).imapc.state == IMAP_STOP) break;
      } while (CVar2 == CURLE_OK);
    }
  }
  Curl_pp_disconnect(&(conn->proto).ftpc.pp);
  Curl_sasl_cleanup(conn,(conn->proto).imapc.cmdid);
  (*Curl_cfree)((conn->proto).imapc.mailbox_uidvalidity);
  (conn->proto).imapc.mailbox_uidvalidity = (char *)0x0;
  return CURLE_OK;
}

Assistant:

static CURLcode pop3_disconnect(struct connectdata *conn, bool dead_connection)
{
  struct pop3_conn *pop3c = &conn->proto.pop3c;

  /* We cannot send quit unconditionally. If this connection is stale or
     bad in any way, sending quit and waiting around here will make the
     disconnect wait in vain and cause more problems than we need to. */

  /* The POP3 session may or may not have been allocated/setup at this
     point! */
  if(!dead_connection && pop3c->pp.conn && pop3c->pp.conn->bits.protoconnstart)
    if(!pop3_perform_quit(conn))
      (void)pop3_block_statemach(conn, TRUE); /* ignore errors on QUIT */

  /* Disconnect from the server */
  Curl_pp_disconnect(&pop3c->pp);

  /* Cleanup the SASL module */
  Curl_sasl_cleanup(conn, pop3c->sasl.authused);

  /* Cleanup our connection based variables */
  Curl_safefree(pop3c->apoptimestamp);

  return CURLE_OK;
}